

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

internalJSONNode * internalJSONNode::newInternal(internalJSONNode *orig)

{
  internalJSONNode *this;
  
  this = (internalJSONNode *)operator_new(0x98);
  internalJSONNode(this,orig);
  return this;
}

Assistant:

internalJSONNode * internalJSONNode::newInternal(const internalJSONNode & orig) {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		return new((internalJSONNode*)json_internal_mempool.allocate()) internalJSONNode(orig);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		return new(json_malloc<internalJSONNode>(1)) internalJSONNode(orig);
	#else /*<- else */
		return new internalJSONNode(orig);
	#endif /*<- */
}